

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageCopyMergeGray
               (gdImagePtr dst,gdImagePtr src,int dstX,int dstY,int srcX,int srcY,int w,int h,
               int pct)

{
  float fVar1;
  int r;
  int g_00;
  int b;
  uint local_80;
  int local_7c;
  int local_78;
  uint local_74;
  int local_64;
  int local_58;
  uint local_54;
  int nc;
  float g;
  int ncB;
  int ncG;
  int ncR;
  int toy;
  int tox;
  int y;
  int x;
  int dc;
  int c;
  int srcY_local;
  int srcX_local;
  int dstY_local;
  int dstX_local;
  gdImagePtr src_local;
  gdImagePtr dst_local;
  
  ncG = dstY;
  for (toy = srcY; ncR = dstX, tox = srcX, toy < srcY + h; toy = toy + 1) {
    for (; tox < srcX + w; tox = tox + 1) {
      local_54 = gdImageGetPixel(src,tox,toy);
      if (src->transparent != local_54) {
        if ((dst != src) || (pct != 100)) {
          local_74 = gdImageGetPixel(dst,ncR,ncG);
          if (dst->trueColor == 0) {
            local_58 = dst->red[(int)local_74];
          }
          else {
            local_58 = (int)(local_74 & 0xff0000) >> 0x10;
          }
          if (dst->trueColor == 0) {
            local_64 = dst->green[(int)local_74];
          }
          else {
            local_64 = (int)(local_74 & 0xff00) >> 8;
          }
          if (dst->trueColor == 0) {
            local_74 = dst->blue[(int)local_74];
          }
          else {
            local_74 = local_74 & 0xff;
          }
          fVar1 = (float)(int)local_74 * 0.114 + (float)local_58 * 0.299 + (float)local_64 * 0.587;
          if (src->trueColor == 0) {
            local_78 = src->red[(int)local_54];
          }
          else {
            local_78 = (int)(local_54 & 0xff0000) >> 0x10;
          }
          r = (int)((float)local_78 * ((float)pct / 100.0) + fVar1 * ((float)(100 - pct) / 100.0));
          if (src->trueColor == 0) {
            local_7c = src->green[(int)local_54];
          }
          else {
            local_7c = (int)(local_54 & 0xff00) >> 8;
          }
          g_00 = (int)((float)local_7c * ((float)pct / 100.0) + fVar1 * ((float)(100 - pct) / 100.0)
                      );
          if (src->trueColor == 0) {
            local_80 = src->blue[(int)local_54];
          }
          else {
            local_80 = local_54 & 0xff;
          }
          b = (int)((float)(int)local_80 * ((float)pct / 100.0) +
                   fVar1 * ((float)(100 - pct) / 100.0));
          local_54 = gdImageColorExact(dst,r,g_00,b);
          if ((local_54 == 0xffffffff) &&
             (local_54 = gdImageColorAllocate(dst,r,g_00,b), local_54 == 0xffffffff)) {
            local_54 = gdImageColorClosest(dst,r,g_00,b);
          }
        }
        gdImageSetPixel(dst,ncR,ncG,local_54);
      }
      ncR = ncR + 1;
    }
    ncG = ncG + 1;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageCopyMergeGray (gdImagePtr dst, gdImagePtr src, int dstX, int dstY,
										int srcX, int srcY, int w, int h, int pct)
{

	int c, dc;
	int x, y;
	int tox, toy;
	int ncR, ncG, ncB;
	float g;
	toy = dstY;
	for (y = srcY; (y < (srcY + h)); y++) {
		tox = dstX;
		for (x = srcX; (x < (srcX + w)); x++) {
			int nc;
			c = gdImageGetPixel (src, x, y);
			/* Added 7/24/95: support transparent copies */
			if (gdImageGetTransparent (src) == c) {
				tox++;
				continue;
			}
			/*
			 * If it's the same image, mapping is NOT trivial since we
			 * merge with greyscale target, but if pct is 100, the grey
			 * value is not used, so it becomes trivial. pjw 2.0.12.
			 */
			if (dst == src && pct == 100) {
				nc = c;
			} else {
				dc = gdImageGetPixel (dst, tox, toy);
				g = 0.29900 * gdImageRed(dst, dc)
				    + 0.58700 * gdImageGreen(dst, dc) + 0.11400 * gdImageBlue(dst, dc);

				ncR = gdImageRed (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncG = gdImageGreen (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncB = gdImageBlue (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);

				/* First look for an exact match */
				nc = gdImageColorExact (dst, ncR, ncG, ncB);
				if (nc == (-1)) {
					/* No, so try to allocate it */
					nc = gdImageColorAllocate (dst, ncR, ncG, ncB);
					/* If we're out of colors, go for the
					   closest color */
					if (nc == (-1)) {
						nc = gdImageColorClosest (dst, ncR, ncG, ncB);
					}
				}
			}
			gdImageSetPixel (dst, tox, toy, nc);
			tox++;
		}
		toy++;
	}
}